

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall
S2Loop::EncodeCompressed(S2Loop *this,Encoder *encoder,S2XYZFaceSiTi *vertices,int snap_level)

{
  bool bVar1;
  unsigned_long uVar2;
  _Base_bitset<1UL> local_40;
  bitset<2UL> properties;
  int snap_level_local;
  S2XYZFaceSiTi *vertices_local;
  Encoder *encoder_local;
  S2Loop *this_local;
  
  Encoder::Ensure(encoder,5);
  Encoder::put_varint32(encoder,this->num_vertices_);
  _properties = absl::MakeSpan<const_S2XYZFaceSiTi>(vertices,(long)this->num_vertices_);
  S2EncodePointsCompressed(_properties,snap_level,encoder);
  local_40._M_w = (_WordT)GetCompressedEncodingProperties(this);
  Encoder::Ensure(encoder,10);
  uVar2 = std::bitset<2UL>::to_ulong((bitset<2UL> *)&local_40);
  Encoder::put_varint32(encoder,(uint32)uVar2);
  Encoder::put_varint32(encoder,this->depth_);
  bVar1 = std::bitset<2UL>::test((bitset<2UL> *)&local_40,1);
  if (bVar1) {
    S2LatLngRect::Encode(&this->bound_,encoder);
  }
  Encoder::avail(encoder);
  return;
}

Assistant:

void S2Loop::EncodeCompressed(Encoder* encoder, const S2XYZFaceSiTi* vertices,
                              int snap_level) const {
  // Ensure enough for the data we write before S2EncodePointsCompressed.
  // S2EncodePointsCompressed ensures its space.
  encoder->Ensure(Encoder::kVarintMax32);
  encoder->put_varint32(num_vertices_);

  S2EncodePointsCompressed(MakeSpan(vertices, num_vertices_),
                           snap_level, encoder);

  std::bitset<kNumProperties> properties = GetCompressedEncodingProperties();

  // Ensure enough only for what we write.  Let the bound ensure its own
  // space.
  encoder->Ensure(2 * Encoder::kVarintMax32);
  encoder->put_varint32(properties.to_ulong());
  encoder->put_varint32(depth_);
  if (properties.test(kBoundEncoded)) {
    bound_.Encode(encoder);
  }
  S2_DCHECK_GE(encoder->avail(), 0);
}